

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<MaterialDataV,_10>::Resize(TPZManVector<MaterialDataV,_10> *this,int64_t newsize)

{
  MaterialDataV *pMVar1;
  undefined1 auVar2 [16];
  ostream *poVar3;
  ulong uVar4;
  ulong *puVar5;
  int64_t i;
  long lVar6;
  MaterialDataV *pMVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  
  if (-1 < newsize) {
    lVar10 = (this->super_TPZVec<MaterialDataV>).fNElements;
    if (lVar10 != newsize) {
      lVar6 = (this->super_TPZVec<MaterialDataV>).fNAlloc;
      if (lVar6 < newsize) {
        if ((ulong)newsize < 0xb) {
          pMVar1 = this->fExtAlloc;
          if ((this->super_TPZVec<MaterialDataV>).fStore != pMVar1) {
            lVar9 = 0;
            for (lVar6 = 0; pMVar7 = (this->super_TPZVec<MaterialDataV>).fStore, lVar6 < lVar10;
                lVar6 = lVar6 + 1) {
              MaterialDataV::operator=
                        ((MaterialDataV *)
                         ((long)(pMVar1->fProperties).super_TPZManVector<double,_10>.fExtAlloc +
                         lVar9 + -0x48),
                         (MaterialDataV *)
                         ((long)(pMVar7->fProperties).super_TPZManVector<double,_10>.fExtAlloc +
                         lVar9 + -0x48));
              lVar10 = (this->super_TPZVec<MaterialDataV>).fNElements;
              lVar9 = lVar9 + 0x98;
            }
            if (pMVar7 != (MaterialDataV *)0x0) {
              dVar12 = pMVar7[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc[9];
              if (dVar12 != 0.0) {
                lVar10 = (long)dVar12 * 0x98;
                do {
                  MaterialDataV::~MaterialDataV
                            ((MaterialDataV *)
                             ((long)pMVar7[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc
                             + lVar10 + -0x48));
                  lVar10 = lVar10 + -0x98;
                } while (lVar10 != 0);
              }
              operator_delete__(pMVar7[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc + 9,
                                (long)dVar12 * 0x98 + 8);
            }
            (this->super_TPZVec<MaterialDataV>).fStore = pMVar1;
          }
          (this->super_TPZVec<MaterialDataV>).fNElements = newsize;
          (this->super_TPZVec<MaterialDataV>).fNAlloc = 0;
        }
        else {
          dVar12 = (double)lVar6 * 1.2;
          uVar11 = (long)dVar12;
          if (dVar12 < (double)newsize) {
            uVar11 = newsize;
          }
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar11;
          uVar4 = SUB168(auVar2 * ZEXT816(0x98),0);
          uVar8 = uVar4 + 8;
          if (0xfffffffffffffff7 < uVar4) {
            uVar8 = 0xffffffffffffffff;
          }
          if (SUB168(auVar2 * ZEXT816(0x98),8) != 0) {
            uVar8 = 0xffffffffffffffff;
          }
          puVar5 = (ulong *)operator_new__(uVar8);
          *puVar5 = uVar11;
          pMVar1 = (MaterialDataV *)(puVar5 + 1);
          if (uVar11 != 0) {
            lVar10 = 0;
            pMVar7 = pMVar1;
            do {
              MaterialDataV::MaterialDataV(pMVar7);
              lVar10 = lVar10 + -0x98;
              pMVar7 = pMVar7 + 1;
            } while (uVar11 * -0x98 - lVar10 != 0);
          }
          lVar6 = 0;
          for (lVar10 = 0; pMVar7 = (this->super_TPZVec<MaterialDataV>).fStore,
              lVar10 < (this->super_TPZVec<MaterialDataV>).fNElements; lVar10 = lVar10 + 1) {
            MaterialDataV::operator=
                      ((MaterialDataV *)
                       ((long)(pMVar1->fProperties).super_TPZManVector<double,_10>.fExtAlloc +
                       lVar6 + -0x48),
                       (MaterialDataV *)
                       ((long)(pMVar7->fProperties).super_TPZManVector<double,_10>.fExtAlloc +
                       lVar6 + -0x48));
            lVar6 = lVar6 + 0x98;
          }
          if (pMVar7 != (MaterialDataV *)0x0 && pMVar7 != this->fExtAlloc) {
            dVar12 = pMVar7[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc[9];
            if (dVar12 != 0.0) {
              lVar10 = (long)dVar12 * 0x98;
              do {
                MaterialDataV::~MaterialDataV
                          ((MaterialDataV *)
                           ((long)pMVar7[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc +
                           lVar10 + -0x48));
                lVar10 = lVar10 + -0x98;
              } while (lVar10 != 0);
            }
            operator_delete__(pMVar7[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc + 9,
                              (long)dVar12 * 0x98 + 8);
          }
          (this->super_TPZVec<MaterialDataV>).fStore = pMVar1;
          (this->super_TPZVec<MaterialDataV>).fNElements = newsize;
          (this->super_TPZVec<MaterialDataV>).fNAlloc = uVar11;
        }
      }
      else {
        (this->super_TPZVec<MaterialDataV>).fNElements = newsize;
      }
    }
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}